

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

void __thiscall
afsm::actions::detail::
action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::connection_fsm_def::terminated>
::operator()(action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::idle,afsm::test::connection_fsm_def::terminated>
             *this,terminate *event,
            state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
            *fsm,idle *source,terminated *target)

{
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::terminate,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def::idle,_afsm::test::connection_fsm_def::terminated,_true>
  local_31;
  terminated *local_30;
  terminated *target_local;
  idle *source_local;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *fsm_local;
  terminate *event_local;
  action_invocation<afsm::test::transit_action,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def::idle,_afsm::test::connection_fsm_def::terminated>
  *this_local;
  
  local_30 = target;
  target_local = (terminated *)source;
  source_local = (idle *)fsm;
  fsm_local = (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
               *)event;
  event_local = (terminate *)this;
  action_invocation_impl<afsm::test::transit_action,_afsm::test::events::terminate,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def::idle,_afsm::test::connection_fsm_def::terminated,_true>
  ::operator()(&local_31,event,fsm,source,target);
  return;
}

Assistant:

void
    operator()(Event&& event, FSM& fsm, SourceState& source, TargetState& target) const
    {
        using invocation_type = action_invocation_impl<
                                    Action, Event, FSM,
                                    SourceState, TargetState,
                                    action_long_signature<Action, Event, FSM,
                                            SourceState, TargetState>::value>;
        invocation_type{}(::std::forward<Event>(event), fsm, source, target);
    }